

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O2

int libssh2_agent_list_identities(LIBSSH2_AGENT *agent)

{
  int iVar1;
  uint32_t uVar2;
  list_node *entry;
  list_head *__dest;
  list_node *plVar3;
  char *errmsg;
  list_node *plVar4;
  LIBSSH2_SESSION *session;
  ulong uVar5;
  uchar *puVar6;
  long lVar7;
  ulong uVar8;
  uchar local_41;
  list_head *local_40;
  ulong local_38;
  
  *(undefined8 *)&(agent->transctx).state = 0;
  (agent->transctx).send_recv_total = 0;
  (agent->transctx).response = (uchar *)0x0;
  (agent->transctx).response_len = 0;
  (agent->transctx).request = (uchar *)0x0;
  (agent->transctx).request_len = 0;
  agent_free_identities(agent);
  local_41 = '\v';
  if ((agent->transctx).state == agent_NB_state_init) {
    (agent->transctx).request = &local_41;
    (agent->transctx).request_len = 1;
    (agent->transctx).send_recv_total = 0;
    (agent->transctx).state = agent_NB_state_request_created;
  }
  else if (*(agent->transctx).request != '\v') {
    iVar1 = _libssh2_error(agent->session,-0x27,"illegal agent request");
    return iVar1;
  }
  if (agent->ops == (agent_ops *)0x0) {
    session = agent->session;
    errmsg = "agent not connected";
    iVar1 = -0x27;
  }
  else {
    iVar1 = (*agent->ops->transact)(agent,&agent->transctx);
    if (iVar1 != 0) {
      (*agent->session->free)((agent->transctx).response,&agent->session->abstract);
      (agent->transctx).response = (uchar *)0x0;
      return iVar1;
    }
    (agent->transctx).request = (uchar *)0x0;
    uVar5 = (agent->transctx).response_len;
    iVar1 = -0x2a;
    if (((0 < (long)uVar5) && (4 < uVar5)) && (puVar6 = (agent->transctx).response, *puVar6 == '\f')
       ) {
      lVar7 = uVar5 - 5;
      uVar2 = _libssh2_ntohu32(puVar6 + 1);
      puVar6 = puVar6 + 5;
      local_40 = &agent->head;
      uVar5 = (ulong)uVar2;
      while( true ) {
        iVar1 = -0x2a;
        if (uVar5 == 0) break;
        if (lVar7 < 4) goto LAB_00107ccd;
        entry = (list_node *)(*agent->session->alloc)(0x40,&agent->session->abstract);
        if (entry == (list_node *)0x0) {
          iVar1 = -6;
          goto LAB_00107ccd;
        }
        uVar2 = _libssh2_ntohu32(puVar6);
        plVar4 = (list_node *)(ulong)uVar2;
        entry[2].next = plVar4;
        uVar8 = (lVar7 + -4) - (long)plVar4;
        if ((long)uVar8 < 0) {
LAB_00107cc4:
          (*agent->session->free)(entry,&agent->session->abstract);
          goto LAB_00107ccd;
        }
        __dest = (list_head *)(*agent->session->alloc)((size_t)plVar4,&agent->session->abstract);
        entry[1].head = __dest;
        if (__dest == (list_head *)0x0) {
          iVar1 = -6;
          goto LAB_00107cc4;
        }
        puVar6 = puVar6 + 4;
        memcpy(__dest,puVar6,(size_t)entry[2].next);
        if (uVar8 < 4) {
LAB_00107cb9:
          (*agent->session->free)(entry[1].head,&agent->session->abstract);
          goto LAB_00107cc4;
        }
        plVar4 = entry[2].next;
        local_38 = uVar5 - 1;
        uVar2 = _libssh2_ntohu32(puVar6 + (long)plVar4);
        uVar5 = (ulong)uVar2;
        lVar7 = (uVar8 - 4) - uVar5;
        if (uVar8 - 4 < uVar5) {
          iVar1 = -0x2a;
          goto LAB_00107cb9;
        }
        plVar3 = (list_node *)(*agent->session->alloc)(uVar5 + 1,&agent->session->abstract);
        entry[2].prev = plVar3;
        if (plVar3 == (list_node *)0x0) {
          iVar1 = -6;
          goto LAB_00107cb9;
        }
        *(undefined1 *)((long)&plVar3->next + uVar5) = 0;
        memcpy(entry[2].prev,puVar6 + (long)((long)&plVar4->next + 4),uVar5);
        puVar6 = puVar6 + (long)((long)&plVar4->next + 4) + uVar5;
        _libssh2_list_add(local_40,entry);
        uVar5 = local_38;
      }
      iVar1 = 0;
    }
LAB_00107ccd:
    (*agent->session->free)((agent->transctx).response,&agent->session->abstract);
    (agent->transctx).response = (uchar *)0x0;
    session = agent->session;
    errmsg = "agent list id failed";
  }
  iVar1 = _libssh2_error(session,iVar1,errmsg);
  return iVar1;
}

Assistant:

static int
agent_list_identities(LIBSSH2_AGENT *agent)
{
    agent_transaction_ctx_t transctx = &agent->transctx;
    ssize_t len, num_identities;
    unsigned char *s;
    int rc;
    unsigned char c = SSH2_AGENTC_REQUEST_IDENTITIES;

    /* Create a request to list identities */
    if(transctx->state == agent_NB_state_init) {
        transctx->request = &c;
        transctx->request_len = 1;
        transctx->send_recv_total = 0;
        transctx->state = agent_NB_state_request_created;
    }

    /* Make sure to be re-called as a result of EAGAIN. */
    if(*transctx->request != SSH2_AGENTC_REQUEST_IDENTITIES)
        return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_USE,
                              "illegal agent request");

    if(!agent->ops)
        /* if no agent has been connected, bail out */
        return _libssh2_error(agent->session, LIBSSH2_ERROR_BAD_USE,
                              "agent not connected");

    rc = agent->ops->transact(agent, transctx);
    if(rc) {
        LIBSSH2_FREE(agent->session, transctx->response);
        transctx->response = NULL;
        return rc;
    }
    transctx->request = NULL;

    len = transctx->response_len;
    s = transctx->response;
    len--;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    if(*s != SSH2_AGENT_IDENTITIES_ANSWER) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    s++;

    /* Read the length of identities */
    len -= 4;
    if(len < 0) {
        rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
        goto error;
    }
    num_identities = _libssh2_ntohu32(s);
    s += 4;

    while(num_identities--) {
        struct agent_publickey *identity;
        size_t comment_len;

        /* Read the length of the blob */
        len -= 4;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            goto error;
        }
        identity = LIBSSH2_ALLOC(agent->session, sizeof(*identity));
        if(!identity) {
            rc = LIBSSH2_ERROR_ALLOC;
            goto error;
        }
        identity->external.blob_len = _libssh2_ntohu32(s);
        s += 4;

        /* Read the blob */
        len -= identity->external.blob_len;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }

        identity->external.blob = LIBSSH2_ALLOC(agent->session,
                                                identity->external.blob_len);
        if(!identity->external.blob) {
            rc = LIBSSH2_ERROR_ALLOC;
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        memcpy(identity->external.blob, s, identity->external.blob_len);
        s += identity->external.blob_len;

        /* Read the length of the comment */
        len -= 4;
        if(len < 0) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        comment_len = _libssh2_ntohu32(s);
        s += 4;

        if(comment_len > (size_t)len) {
            rc = LIBSSH2_ERROR_AGENT_PROTOCOL;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        /* Read the comment */
        len -= comment_len;

        identity->external.comment = LIBSSH2_ALLOC(agent->session,
                                                   comment_len + 1);
        if(!identity->external.comment) {
            rc = LIBSSH2_ERROR_ALLOC;
            LIBSSH2_FREE(agent->session, identity->external.blob);
            LIBSSH2_FREE(agent->session, identity);
            goto error;
        }
        identity->external.comment[comment_len] = '\0';
        memcpy(identity->external.comment, s, comment_len);
        s += comment_len;

        _libssh2_list_add(&agent->head, &identity->node);
    }
error:
    LIBSSH2_FREE(agent->session, transctx->response);
    transctx->response = NULL;

    return _libssh2_error(agent->session, rc,
                          "agent list id failed");
}